

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::DescriptorBuilder::CrossLinkMessage
          (DescriptorBuilder *this,Descriptor *message,DescriptorProto *proto)

{
  int *piVar1;
  long *plVar2;
  Message *descriptor;
  undefined8 *puVar3;
  long lVar4;
  MessageOptions *pMVar5;
  FieldDescriptor **ppFVar6;
  OneofOptions *pOVar7;
  ulong uVar8;
  ulong uVar9;
  DescriptorProto *extraout_RDX;
  DescriptorProto *extraout_RDX_00;
  DescriptorProto *extraout_RDX_01;
  DescriptorProto *extraout_RDX_02;
  DescriptorProto *extraout_RDX_03;
  DescriptorProto *extraout_RDX_04;
  int iVar10;
  DescriptorBuilder *this_00;
  int i;
  long lVar11;
  long lVar12;
  DescriptorProto *arg9;
  SubstituteArg local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  SubstituteArg local_1f0;
  SubstituteArg local_1c0;
  SubstituteArg local_190;
  SubstituteArg local_160;
  SubstituteArg local_130;
  SubstituteArg local_100;
  SubstituteArg local_d0;
  SubstituteArg local_a0;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  this_00 = this;
  arg9 = proto;
  if (*(long *)(message + 0x20) == 0) {
    pMVar5 = MessageOptions::default_instance();
    *(MessageOptions **)(message + 0x20) = pMVar5;
    proto = extraout_RDX;
  }
  lVar12 = 0;
  for (lVar11 = 0; lVar11 < *(int *)(message + 0x70); lVar11 = lVar11 + 1) {
    this_00 = this;
    CrossLinkMessage(this,(Descriptor *)(*(long *)(message + 0x38) + lVar12),
                     (DescriptorProto *)
                     ((arg9->nested_type_).super_RepeatedPtrFieldBase.rep_)->elements[lVar11]);
    lVar12 = lVar12 + 0x90;
    proto = extraout_RDX_00;
  }
  lVar12 = 0;
  for (lVar11 = 0; lVar11 < *(int *)(message + 0x74); lVar11 = lVar11 + 1) {
    this_00 = this;
    CrossLinkEnum(this,(EnumDescriptor *)(*(long *)(message + 0x40) + lVar12),
                  (EnumDescriptorProto *)
                  ((arg9->enum_type_).super_RepeatedPtrFieldBase.rep_)->elements[lVar11]);
    lVar12 = lVar12 + 0x50;
    proto = extraout_RDX_01;
  }
  lVar12 = 0;
  for (lVar11 = 0; lVar11 < *(int *)(message + 0x68); lVar11 = lVar11 + 1) {
    this_00 = this;
    CrossLinkField(this,(FieldDescriptor *)(*(long *)(message + 0x28) + lVar12),
                   (FieldDescriptorProto *)
                   ((arg9->field_).super_RepeatedPtrFieldBase.rep_)->elements[lVar11]);
    lVar12 = lVar12 + 0x98;
    proto = extraout_RDX_02;
  }
  lVar12 = 0;
  for (lVar11 = 0; lVar11 < *(int *)(message + 0x7c); lVar11 = lVar11 + 1) {
    this_00 = this;
    CrossLinkField(this,(FieldDescriptor *)(*(long *)(message + 0x50) + lVar12),
                   (FieldDescriptorProto *)
                   ((arg9->extension_).super_RepeatedPtrFieldBase.rep_)->elements[lVar11]);
    lVar12 = lVar12 + 0x98;
    proto = extraout_RDX_03;
  }
  lVar12 = 0;
  for (lVar11 = 0; lVar11 < *(int *)(message + 0x78); lVar11 = lVar11 + 1) {
    CrossLinkExtensionRange
              (this_00,(ExtensionRange *)(*(long *)(message + 0x48) + lVar12),
               (ExtensionRange *)proto);
    lVar12 = lVar12 + 0x10;
    proto = extraout_RDX_04;
  }
  lVar11 = -0x13;
  for (lVar12 = 0; lVar12 < *(int *)(message + 0x68); lVar12 = lVar12 + 1) {
    plVar2 = *(long **)(*(long *)(message + 0x28) + 0xf0 + lVar11 * 8);
    if (plVar2 != (long *)0x0) {
      if ((0 < (int)plVar2[3]) &&
         (*(long **)(*(long *)(message + 0x28) + 0x58 + lVar11 * 8) != plVar2)) {
        std::operator+(&local_240,
                       *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                        (message + 8),".");
        std::operator+(&local_50,&local_240,
                       *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                        (*(long *)(message + 0x28) + lVar11 * 8));
        descriptor = (Message *)
                     ((arg9->field_).super_RepeatedPtrFieldBase.rep_)->elements[lVar12 + -1];
        puVar3 = *(undefined8 **)(*(long *)(message + 0x28) + lVar11 * 8);
        local_220._M_dataplus._M_p = (pointer)*puVar3;
        local_220._M_string_length._0_4_ = *(undefined4 *)(puVar3 + 1);
        local_270.text_ = *(char **)*plVar2;
        local_270.size_ = *(int *)((undefined8 *)*plVar2 + 1);
        local_a0.text_ = (char *)0x0;
        local_a0.size_ = -1;
        local_d0.text_ = (char *)0x0;
        local_d0.size_ = -1;
        local_100.text_ = (char *)0x0;
        local_100.size_ = -1;
        local_130.text_ = (char *)0x0;
        local_130.size_ = -1;
        local_160.text_ = (char *)0x0;
        local_160.size_ = -1;
        local_190.text_ = (char *)0x0;
        local_190.size_ = -1;
        local_1c0.text_ = (char *)0x0;
        local_1c0.size_ = -1;
        local_1f0.text_ = (char *)0x0;
        local_1f0.size_ = -1;
        strings::Substitute_abi_cxx11_
                  (&local_70,
                   (strings *)
                   "Fields in the same oneof must be defined consecutively. \"$0\" cannot be defined before the completion of the \"$1\" oneof definition."
                   ,(char *)&local_220,&local_270,&local_a0,&local_d0,&local_100,&local_130,
                   &local_160,&local_190,&local_1c0,&local_1f0,(SubstituteArg *)arg9);
        AddError(this,&local_50,descriptor,TYPE,&local_70);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_240);
      }
      piVar1 = (int *)(*(long *)(message + 0x30) + 0x18 +
                      (long)(int)(((long)plVar2 - *(long *)(plVar2[2] + 0x30)) / 0x30) * 0x30);
      *piVar1 = *piVar1 + 1;
    }
    lVar11 = lVar11 + 0x13;
  }
  lVar11 = 5;
  for (lVar12 = 0; lVar12 < *(int *)(message + 0x6c); lVar12 = lVar12 + 1) {
    lVar4 = *(long *)(message + 0x30);
    iVar10 = *(int *)(lVar4 + -0x10 + lVar11 * 8);
    if (iVar10 == 0) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_270
                     ,*(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                       (message + 8),".");
      std::operator+(&local_220,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_270
                     ,*(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                       (lVar4 + -0x28 + lVar11 * 8));
      AddError(this,&local_220,
               (Message *)((arg9->oneof_decl_).super_RepeatedPtrFieldBase.rep_)->elements[lVar12],
               NAME,"Oneof must have at least one field.");
      std::__cxx11::string::~string((string *)&local_220);
      std::__cxx11::string::~string((string *)&local_270);
      iVar10 = *(int *)(lVar4 + -0x10 + lVar11 * 8);
    }
    ppFVar6 = DescriptorPool::Tables::AllocateArray<google::protobuf::FieldDescriptor_const*>
                        (this->tables_,iVar10);
    *(FieldDescriptor ***)(lVar4 + -8 + lVar11 * 8) = ppFVar6;
    *(undefined4 *)(lVar4 + -0x10 + lVar11 * 8) = 0;
    if (*(long *)(lVar4 + lVar11 * 8) == 0) {
      pOVar7 = OneofOptions::default_instance();
      *(OneofOptions **)(lVar4 + lVar11 * 8) = pOVar7;
    }
    lVar11 = lVar11 + 6;
  }
  uVar9 = 0;
  uVar8 = (ulong)*(uint *)(message + 0x68);
  if ((int)*(uint *)(message + 0x68) < 1) {
    uVar8 = uVar9;
  }
  for (; uVar8 * 0x98 - uVar9 != 0; uVar9 = uVar9 + 0x98) {
    lVar11 = *(long *)(message + 0x28);
    lVar12 = *(long *)(lVar11 + 0x58 + uVar9);
    if (lVar12 != 0) {
      lVar4 = *(long *)(message + 0x30);
      lVar12 = (long)(int)((lVar12 - *(long *)(*(long *)(lVar12 + 0x10) + 0x30)) / 0x30) * 0x30;
      iVar10 = *(int *)(lVar4 + 0x18 + lVar12);
      *(int *)(lVar11 + 0x48 + uVar9) = iVar10;
      *(int *)(lVar4 + 0x18 + lVar12) = iVar10 + 1;
      *(ulong *)(*(long *)(lVar4 + 0x20 + lVar12) + (long)iVar10 * 8) = lVar11 + uVar9;
    }
  }
  return;
}

Assistant:

void DescriptorBuilder::CrossLinkMessage(Descriptor* message,
                                         const DescriptorProto& proto) {
  if (message->options_ == nullptr) {
    message->options_ = &MessageOptions::default_instance();
  }

  for (int i = 0; i < message->nested_type_count(); i++) {
    CrossLinkMessage(&message->nested_types_[i], proto.nested_type(i));
  }

  for (int i = 0; i < message->enum_type_count(); i++) {
    CrossLinkEnum(&message->enum_types_[i], proto.enum_type(i));
  }

  for (int i = 0; i < message->field_count(); i++) {
    CrossLinkField(&message->fields_[i], proto.field(i));
  }

  for (int i = 0; i < message->extension_count(); i++) {
    CrossLinkField(&message->extensions_[i], proto.extension(i));
  }

  for (int i = 0; i < message->extension_range_count(); i++) {
    CrossLinkExtensionRange(&message->extension_ranges_[i],
                            proto.extension_range(i));
  }

  // Set up field array for each oneof.

  // First count the number of fields per oneof.
  for (int i = 0; i < message->field_count(); i++) {
    const OneofDescriptor* oneof_decl = message->field(i)->containing_oneof();
    if (oneof_decl != nullptr) {
      // Make sure fields belonging to the same oneof are defined consecutively.
      // This enables optimizations in codegens and reflection libraries to
      // skip fields in the oneof group, as only one of the field can be set.
      // Note that field_count() returns how many fields in this oneof we have
      // seen so far. field_count() > 0 guarantees that i > 0, so field(i-1) is
      // safe.
      if (oneof_decl->field_count() > 0 &&
          message->field(i - 1)->containing_oneof() != oneof_decl) {
        AddError(message->full_name() + "." + message->field(i - 1)->name(),
                 proto.field(i - 1), DescriptorPool::ErrorCollector::TYPE,
                 strings::Substitute(
                     "Fields in the same oneof must be defined consecutively. "
                     "\"$0\" cannot be defined before the completion of the "
                     "\"$1\" oneof definition.",
                     message->field(i - 1)->name(), oneof_decl->name()));
      }
      // Must go through oneof_decls_ array to get a non-const version of the
      // OneofDescriptor.
      ++message->oneof_decls_[oneof_decl->index()].field_count_;
    }
  }

  // Then allocate the arrays.
  for (int i = 0; i < message->oneof_decl_count(); i++) {
    OneofDescriptor* oneof_decl = &message->oneof_decls_[i];

    if (oneof_decl->field_count() == 0) {
      AddError(message->full_name() + "." + oneof_decl->name(),
               proto.oneof_decl(i), DescriptorPool::ErrorCollector::NAME,
               "Oneof must have at least one field.");
    }

    oneof_decl->fields_ = tables_->AllocateArray<const FieldDescriptor*>(
        oneof_decl->field_count_);
    oneof_decl->field_count_ = 0;

    if (oneof_decl->options_ == nullptr) {
      oneof_decl->options_ = &OneofOptions::default_instance();
    }
  }

  // Then fill them in.
  for (int i = 0; i < message->field_count(); i++) {
    const OneofDescriptor* oneof_decl = message->field(i)->containing_oneof();
    if (oneof_decl != nullptr) {
      OneofDescriptor* mutable_oneof_decl =
          &message->oneof_decls_[oneof_decl->index()];
      message->fields_[i].index_in_oneof_ = mutable_oneof_decl->field_count_;
      mutable_oneof_decl->fields_[mutable_oneof_decl->field_count_++] =
          message->field(i);
    }
  }
}